

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall ImDrawListSplitter::ClearFreeMemory(ImDrawListSplitter *this)

{
  undefined8 *puVar1;
  ImDrawChannel *pIVar2;
  int i;
  ulong uVar3;
  long lVar4;
  
  lVar4 = 0;
  for (uVar3 = 0; (long)uVar3 < (long)(this->_Channels).Size; uVar3 = uVar3 + 1) {
    if (uVar3 == (uint)this->_Current) {
      pIVar2 = (this->_Channels).Data;
      puVar1 = (undefined8 *)((long)&(pIVar2->_IdxBuffer).Size + lVar4);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)((long)&(pIVar2->_CmdBuffer).Size + lVar4);
      *puVar1 = 0;
      puVar1[1] = 0;
    }
    ImVector<ImDrawCmd>::clear
              ((ImVector<ImDrawCmd> *)((long)&(((this->_Channels).Data)->_CmdBuffer).Size + lVar4));
    ImVector<unsigned_short>::clear
              ((ImVector<unsigned_short> *)
               ((long)&(((this->_Channels).Data)->_IdxBuffer).Size + lVar4));
    lVar4 = lVar4 + 0x20;
  }
  this->_Current = 0;
  this->_Count = 1;
  ImVector<ImDrawChannel>::clear(&this->_Channels);
  return;
}

Assistant:

void ImDrawListSplitter::ClearFreeMemory()
{
    for (int i = 0; i < _Channels.Size; i++)
    {
        if (i == _Current)
            memset(&_Channels[i], 0, sizeof(_Channels[i]));  // Current channel is a copy of CmdBuffer/IdxBuffer, don't destruct again
        _Channels[i]._CmdBuffer.clear();
        _Channels[i]._IdxBuffer.clear();
    }
    _Current = 0;
    _Count = 1;
    _Channels.clear();
}